

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

uint __thiscall
ON_SubDComponentList::CreateFromComponentList
          (ON_SubDComponentList *this,ON_SubD *subd,
          ON_SimpleArray<ON_COMPONENT_INDEX> *component_list)

{
  bool bVar1;
  uint uVar2;
  ON_SubDVertex *pOVar3;
  uint marked_component_count;
  ON_ComponentStatus *this_00;
  uint i;
  ulong uVar4;
  ON_SubDComponentMarksClearAndRestore saved_marks;
  
  ON_SubDComponentMarksClearAndRestore::ON_SubDComponentMarksClearAndRestore(&saved_marks,subd);
  uVar2 = component_list->m_count;
  marked_component_count = 0;
  for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    if (component_list->m_a[uVar4].m_type == subd_vertex) {
      pOVar3 = ON_SubD::VertexFromId(subd,component_list->m_a[uVar4].m_index);
      if (pOVar3 != (ON_SubDVertex *)0x0) {
        this_00 = &(pOVar3->super_ON_SubDComponentBase).m_status;
        bVar1 = ON_ComponentStatus::RuntimeMark(this_00);
        if (!bVar1) {
          ON_ComponentStatus::SetRuntimeMark(this_00);
          marked_component_count = marked_component_count + 1;
        }
      }
    }
  }
  uVar2 = Internal_Create(this,subd,true,true,true,true,marked_component_count);
  ON_SubDComponentMarksClearAndRestore::~ON_SubDComponentMarksClearAndRestore(&saved_marks);
  return uVar2;
}

Assistant:

unsigned ON_SubDComponentList::CreateFromComponentList(const ON_SubD& subd, const ON_SimpleArray<ON_COMPONENT_INDEX>& component_list)
{
  ON_SubDComponentMarksClearAndRestore saved_marks(subd);
  const unsigned count = component_list.UnsignedCount();
  unsigned marked_count = 0;
  for (unsigned i = 0; i < count; ++i)
  {
    const ON_COMPONENT_INDEX ci = component_list[i];
    if (ON_COMPONENT_INDEX::TYPE::subd_vertex != ci.m_type)
      continue;
    const unsigned vertex_id = (unsigned)ci.m_index;
    const ON_SubDVertex* v = subd.VertexFromId(vertex_id);
    if (nullptr == v)
      continue;
    if (v->m_status.RuntimeMark())
      continue;
    v->m_status.SetRuntimeMark();
    ++marked_count;
  }
  return Internal_Create(subd, true, true, true, true, marked_count);
}